

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O2

void av1_dist_wtd_convolve_x_c
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,int subpel_x_qn,ConvolveParams *conv_params)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  int16_t *piVar4;
  CONV_BUF_TYPE *pCVar5;
  char cVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  uint8_t uVar10;
  char cVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int k;
  ulong uVar18;
  ulong uVar19;
  
  uVar2 = filter_params_x->taps;
  cVar6 = (char)conv_params->round_1;
  cVar11 = cVar6 + (char)conv_params->round_0;
  iVar17 = (1 << (0x15U - cVar11 & 0x1f)) + (1 << (0x16U - cVar11 & 0x1f));
  piVar4 = filter_params_x->filter_ptr;
  uVar12 = (ulong)(uint)w;
  if (w < 1) {
    uVar12 = 0;
  }
  uVar13 = (ulong)(uint)h;
  if (h < 1) {
    uVar13 = 0;
  }
  iVar15 = 1 - (uint)(uVar2 >> 1);
  pCVar5 = conv_params->dst;
  iVar3 = conv_params->dst_stride;
  for (uVar9 = 0; uVar9 != uVar13; uVar9 = uVar9 + 1) {
    lVar8 = uVar9 * (long)iVar3;
    iVar16 = iVar15;
    for (uVar19 = 0; uVar19 != uVar12; uVar19 = uVar19 + 1) {
      iVar14 = 0;
      for (uVar18 = 0; filter_params_x->taps != uVar18; uVar18 = uVar18 + 1) {
        iVar14 = iVar14 + (uint)src[uVar18 + (long)iVar16] *
                          (int)*(short *)((long)piVar4 +
                                         uVar18 * 2 +
                                         (ulong)((subpel_x_qn & 0xfU) * (uint)uVar2 * 2));
      }
      bVar1 = (byte)conv_params->round_0;
      iVar14 = ((((1 << (bVar1 & 0x1f)) >> 1) + iVar14 >> (bVar1 & 0x1f)) << (7U - cVar6 & 0x1f)) +
               iVar17;
      if (conv_params->do_average == 0) {
        pCVar5[lVar8 + uVar19] = (CONV_BUF_TYPE)iVar14;
      }
      else {
        uVar7 = (uint)pCVar5[lVar8 + uVar19];
        if (conv_params->use_dist_wtd_comp_avg == 0) {
          iVar14 = (int)(iVar14 + uVar7) >> 1;
        }
        else {
          iVar14 = (int)(iVar14 * conv_params->bck_offset + uVar7 * conv_params->fwd_offset) >> 4;
        }
        iVar14 = iVar14 + (((1 << (0xeU - cVar11 & 0x1f)) >> 1) - iVar17) >> (0xeU - cVar11 & 0x1f);
        if (iVar14 < 1) {
          iVar14 = 0;
        }
        uVar10 = (uint8_t)iVar14;
        if (0xfe < iVar14) {
          uVar10 = 0xff;
        }
        dst[uVar19 + uVar9 * (long)dst_stride] = uVar10;
      }
      iVar16 = iVar16 + 1;
    }
    iVar15 = iVar15 + src_stride;
  }
  return;
}

Assistant:

void av1_dist_wtd_convolve_x_c(const uint8_t *src, int src_stride, uint8_t *dst,
                               int dst_stride, int w, int h,
                               const InterpFilterParams *filter_params_x,
                               const int subpel_x_qn,
                               ConvolveParams *conv_params) {
  CONV_BUF_TYPE *dst16 = conv_params->dst;
  int dst16_stride = conv_params->dst_stride;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const int bits = FILTER_BITS - conv_params->round_1;
  const int bd = 8;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  const int round_offset = (1 << (offset_bits - conv_params->round_1)) +
                           (1 << (offset_bits - conv_params->round_1 - 1));
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;

  // horizontal filter
  const int16_t *x_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_x, subpel_x_qn & SUBPEL_MASK);
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t res = 0;
      for (int k = 0; k < filter_params_x->taps; ++k) {
        res += x_filter[k] * src[y * src_stride + x - fo_horiz + k];
      }
      res = (1 << bits) * ROUND_POWER_OF_TWO(res, conv_params->round_0);
      res += round_offset;

      if (conv_params->do_average) {
        int32_t tmp = dst16[y * dst16_stride + x];
        if (conv_params->use_dist_wtd_comp_avg) {
          tmp = tmp * conv_params->fwd_offset + res * conv_params->bck_offset;
          tmp = tmp >> DIST_PRECISION_BITS;
        } else {
          tmp += res;
          tmp = tmp >> 1;
        }
        tmp -= round_offset;
        dst[y * dst_stride + x] =
            clip_pixel(ROUND_POWER_OF_TWO(tmp, round_bits));
      } else {
        dst16[y * dst16_stride + x] = res;
      }
    }
  }
}